

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnp::DynamicStruct,_(capnp::Style)2>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnp::DynamicStruct,_(capnp::Style)2> *this,JsonCodec *codec,Reader input,
          Type type,Orphanage orphanage)

{
  StructSchema SVar1;
  undefined4 local_88;
  undefined4 uStack_80;
  undefined4 local_78;
  undefined4 uStack_70;
  StructDataBitCount local_68;
  int iStack_60;
  Orphan<capnp::DynamicStruct> local_58;
  Type local_30;
  
  local_30.field_4 = type.field_4;
  local_30._0_8_ = type._0_8_;
  SVar1 = Type::asStruct(&local_30);
  local_88 = input._reader.segment._0_4_;
  uStack_80 = input._reader.capTable._0_4_;
  local_78 = input._reader.data._0_4_;
  uStack_70 = input._reader.pointers._0_4_;
  local_68 = input._reader.dataSize;
  iStack_60 = input._reader.nestingLimit;
  (*(this->super_HandlerBase)._vptr_HandlerBase[5])
            (&local_58,this,codec,SVar1.super_Schema.raw,orphanage.arena,orphanage.capTable,local_88
             ,uStack_80,local_78,uStack_70,local_68,iStack_60);
  Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,&local_58);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_58.builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return decode(codec, input, type.asStruct(), orphanage);
  }